

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaic
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,int rows,int columns)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 local_bc [8];
  Vertex4Tex4 upperRightVertex;
  Vertex4Tex4 lowerRightVertex;
  Vertex4Tex4 upperLeftVertex;
  undefined1 local_50 [8];
  Vertex4Tex4 lowerLeftVertex;
  int columnNdx;
  int rowNdx;
  int arrayIndex;
  float columnSize;
  float rowSize;
  int columns_local;
  int rows_local;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *vertices;
  
  std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::vector
            (__return_storage_ptr__);
  fVar1 = 2.0 / (float)rows;
  fVar2 = 2.0 / (float)columns;
  columnNdx = 0;
  for (lowerLeftVertex.texCoord.m_data[3] = 0.0; (int)lowerLeftVertex.texCoord.m_data[3] < rows;
      lowerLeftVertex.texCoord.m_data[3] = (float)((int)lowerLeftVertex.texCoord.m_data[3] + 1)) {
    for (lowerLeftVertex.texCoord.m_data[2] = 0.0; (int)lowerLeftVertex.texCoord.m_data[2] < columns
        ; lowerLeftVertex.texCoord.m_data[2] = (float)((int)lowerLeftVertex.texCoord.m_data[2] + 1))
    {
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)local_50,
                 (float)(int)lowerLeftVertex.texCoord.m_data[2] * fVar2 + -1.0,
                 (float)(int)lowerLeftVertex.texCoord.m_data[3] * fVar1 + -1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(lowerLeftVertex.position.m_data + 2),0.0,0.0,(float)columnNdx,
                 0.0);
      fVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_50);
      fVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_50);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(lowerRightVertex.texCoord.m_data + 2),fVar3,fVar4 + fVar1,0.0,
                 1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(upperLeftVertex.position.m_data + 2),0.0,1.0,(float)columnNdx,
                 0.0);
      fVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_50);
      fVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_50);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(upperRightVertex.texCoord.m_data + 2),fVar3 + fVar2,fVar4,0.0,
                 1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(lowerRightVertex.position.m_data + 2),1.0,0.0,(float)columnNdx
                 ,0.0);
      fVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_50);
      fVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_50);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)local_bc,fVar3 + fVar2,fVar4 + fVar1,0.0,1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(upperRightVertex.position.m_data + 2),1.0,1.0,(float)columnNdx
                 ,0.0);
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,(value_type *)local_50);
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,(value_type *)(upperRightVertex.texCoord.m_data + 2));
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,(value_type *)(lowerRightVertex.texCoord.m_data + 2));
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,(value_type *)(lowerRightVertex.texCoord.m_data + 2));
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,(value_type *)(upperRightVertex.texCoord.m_data + 2));
      std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
      push_back(__return_storage_ptr__,(value_type *)local_bc);
      columnNdx = columnNdx + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaic (int rows, int columns)
{
	using tcu::Vec4;

	DE_ASSERT(rows >= 1);
	DE_ASSERT(columns >= 1);

	std::vector<Vertex4Tex4>	vertices;
	const float					rowSize		= 2.0f / (float)rows;
	const float					columnSize	= 2.0f / (float)columns;
	int							arrayIndex	= 0;

	for (int rowNdx = 0; rowNdx < rows; rowNdx++)
	{
		for (int columnNdx = 0; columnNdx < columns; columnNdx++)
		{
			const Vertex4Tex4 lowerLeftVertex =
			{
				Vec4(-1.0f + (float)columnNdx * columnSize, -1.0f + (float)rowNdx * rowSize, 0.0f, 1.0f),
				Vec4(0.0f, 0.0f, (float)arrayIndex, 0.0f)
			};
			const Vertex4Tex4 upperLeftVertex =
			{
				Vec4(lowerLeftVertex.position.x(), lowerLeftVertex.position.y() + rowSize, 0.0f, 1.0f),
				Vec4(0.0f, 1.0f, (float)arrayIndex, 0.0f)
			};
			const Vertex4Tex4 lowerRightVertex =
			{
				Vec4(lowerLeftVertex.position.x() + columnSize, lowerLeftVertex.position.y(), 0.0f, 1.0f),
				Vec4(1.0f, 0.0f, (float)arrayIndex, 0.0f)
			};
			const Vertex4Tex4 upperRightVertex =
			{
				Vec4(lowerLeftVertex.position.x() + columnSize, lowerLeftVertex.position.y() + rowSize, 0.0f, 1.0f),
				Vec4(1.0f, 1.0f, (float)arrayIndex, 0.0f)
			};

			vertices.push_back(lowerLeftVertex);
			vertices.push_back(lowerRightVertex);
			vertices.push_back(upperLeftVertex);
			vertices.push_back(upperLeftVertex);
			vertices.push_back(lowerRightVertex);
			vertices.push_back(upperRightVertex);

			arrayIndex++;
		}
	}

	return vertices;
}